

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O2

void __thiscall
TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::AddKel
          (TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *this,
          TPZFMatrix<double> *elmat,TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  TPZFrontNonSym<double> *this_00;
  TPZEqnArray<double> *this_01;
  ostream *poVar1;
  int64_t maxeq;
  int64_t mineq;
  long local_38;
  long local_30;
  
  this_00 = &(this->super_TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>
             ).fFront;
  TPZFrontNonSym<double>::AddKel(this_00,elmat,sourceindex,destinationindex);
  TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::EquationsToDecompose
            (&this->super_TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>
             ,destinationindex,&local_30,&local_38);
  if (local_30 <= local_38) {
    this_01 = (TPZEqnArray<double> *)operator_new(0x3290);
    TPZEqnArray<double>::TPZEqnArray(this_01);
    TPZFrontNonSym<double>::DecomposeEquations(this_00,local_30,local_38,this_01);
    TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::CheckCompress
              (&this->
                super_TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>);
    std::mutex::lock(&this->fwritelock);
    TPZStack<TPZEqnArray<double>_*,_10>::Push(&this->fEqnStack,this_01);
    if (local_38 ==
        (this->super_TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>).
        super_TPZAbstractFrontMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + -1)
    {
      poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar1 = std::operator<<(poVar1,"Decomposition finished");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::ostream::flush();
      FinishWriting(this);
      TPZFrontNonSym<double>::Reset(this_00,0);
    }
    std::condition_variable::notify_all();
    pthread_mutex_unlock((pthread_mutex_t *)&this->fwritelock);
  }
  (this->super_TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>).
  super_TPZAbstractFrontMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed =
       (char)(this->super_TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>
             ).fFront.super_TPZFront<double>.fDecomposeType;
  return;
}

Assistant:

void TPZParFrontMatrix<TVar, store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & sourceindex, TPZVec < int64_t > & destinationindex)
{
	this->fFront.AddKel(elmat, sourceindex, destinationindex);
#ifdef PZ_LOG
    if (loggerfw.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< this->fFront.FrontSize();
		LOGPZ_DEBUG(loggerfw,sout.str())
	}
#endif
	int64_t mineq, maxeq;
	this->EquationsToDecompose(destinationindex, mineq, maxeq);

	if(maxeq >= mineq) {
		TPZEqnArray<TVar> *AuxEqn = new TPZEqnArray<TVar>;

		this->fFront.DecomposeEquations(mineq,maxeq,*AuxEqn);
		this->CheckCompress();
        std::lock_guard<std::mutex> lock(fwritelock);
		fEqnStack.Push(AuxEqn);
		if(maxeq == this->Rows()-1){
            //check if writeing is over and closes file
			cout << endl << "Decomposition finished" << endl;
			cout.flush();
			FinishWriting();
			this->fFront.Reset(0);
			//fStorage.ReOpen();
		}
        fwritecond.notify_all();
	}
	this->fDecomposed = this->fFront.GetDecomposeType();
}